

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetGXToolInfo(ndicapi *pol,int port)

{
  unsigned_long uVar1;
  char (*local_28) [12];
  char *dp;
  int port_local;
  ndicapi *pol_local;
  
  if ((port < 0x31) || (0x33 < port)) {
    if ((port < 0x41) || (0x49 < port)) {
      return 0;
    }
    local_28 = pol->GxPassiveInformation + (port + -0x41);
  }
  else {
    local_28 = pol->GxInformation + (port + -0x31);
  }
  uVar1 = ndiHexToUnsignedLong(*local_28,2);
  return (int)uVar1;
}

Assistant:

ndicapiExport int ndiGetGXToolInfo(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxInformation[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->GxPassiveInformation[port - 'A'];
  }
  else
  {
    return 0;
  }

  return (int)ndiHexToUnsignedLong(dp, 2);
}